

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

int __thiscall zmq::stream_t::xsend(stream_t *this,msg_t *msg_)

{
  pipe_t *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  uchar *puVar6;
  out_pipe_t *poVar7;
  int *piVar8;
  size_t in_RCX;
  void *__buf;
  int iVar9;
  EVP_PKEY_CTX *pEVar10;
  blob_t *routing_id_;
  blob_t local_30;
  
  if (this->_more_out != false) {
    pEVar10 = (EVP_PKEY_CTX *)0x1;
    msg_t::reset_flags(msg_,'\x01');
    this->_more_out = false;
    if (this->_current_out == (pipe_t *)0x0) {
      iVar3 = msg_t::close(msg_,(int)pEVar10);
      if (iVar3 != 0) {
        xsend();
      }
    }
    else {
      sVar4 = msg_t::size(msg_);
      if (sVar4 == 0) {
        pEVar10 = (EVP_PKEY_CTX *)0x0;
        pipe_t::terminate(this->_current_out,false);
        iVar3 = msg_t::close(msg_,(int)pEVar10);
        if (iVar3 != 0) {
          xsend();
        }
        iVar3 = msg_t::init(msg_,pEVar10);
        if (iVar3 != 0) {
          xsend();
        }
        this->_current_out = (pipe_t *)0x0;
        return 0;
      }
      pEVar10 = (EVP_PKEY_CTX *)msg_;
      sVar5 = pipe_t::write(this->_current_out,(int)msg_,__buf,in_RCX);
      if ((char)sVar5 != '\0') {
        pipe_t::flush(this->_current_out);
      }
      this->_current_out = (pipe_t *)0x0;
    }
    iVar3 = msg_t::init(msg_,pEVar10);
    if (iVar3 == 0) {
      return 0;
    }
    xsend();
    return 0;
  }
  routing_id_ = (blob_t *)msg_;
  if (this->_current_out != (pipe_t *)0x0) {
    xsend();
  }
  bVar1 = msg_t::flags(msg_);
  if ((bVar1 & 1) == 0) {
LAB_001881da:
    this->_more_out = true;
    iVar3 = msg_t::close(msg_,(int)routing_id_);
    if (iVar3 != 0) {
      xsend();
    }
    iVar3 = msg_t::init(msg_,(EVP_PKEY_CTX *)routing_id_);
    iVar9 = 0;
    if (iVar3 != 0) {
      xsend();
    }
  }
  else {
    puVar6 = (uchar *)msg_t::data(msg_);
    local_30._size = msg_t::size(msg_);
    routing_id_ = &local_30;
    local_30._owned = false;
    local_30._data = puVar6;
    poVar7 = routing_socket_base_t::lookup_out_pipe(&this->super_routing_socket_base_t,routing_id_);
    if (local_30._owned == true) {
      free(local_30._data);
    }
    if (poVar7 == (out_pipe_t *)0x0) {
      piVar8 = __errno_location();
      *piVar8 = 0x71;
    }
    else {
      this_00 = poVar7->pipe;
      this->_current_out = this_00;
      bVar2 = pipe_t::check_write(this_00);
      if (bVar2) goto LAB_001881da;
      poVar7->active = false;
      this->_current_out = (pipe_t *)0x0;
      piVar8 = __errno_location();
      *piVar8 = 0xb;
    }
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int zmq::stream_t::xsend (msg_t *msg_)
{
    //  If this is the first part of the message it's the ID of the
    //  peer to send the message to.
    if (!_more_out) {
        zmq_assert (!_current_out);

        //  If we have malformed message (prefix with no subsequent message)
        //  then just silently ignore it.
        //  TODO: The connections should be killed instead.
        if (msg_->flags () & msg_t::more) {
            //  Find the pipe associated with the routing id stored in the prefix.
            //  If there's no such pipe return an error

            out_pipe_t *out_pipe = lookup_out_pipe (
              blob_t (static_cast<unsigned char *> (msg_->data ()),
                      msg_->size (), reference_tag_t ()));

            if (out_pipe) {
                _current_out = out_pipe->pipe;
                if (!_current_out->check_write ()) {
                    out_pipe->active = false;
                    _current_out = NULL;
                    errno = EAGAIN;
                    return -1;
                }
            } else {
                errno = EHOSTUNREACH;
                return -1;
            }
        }

        //  Expect one more message frame.
        _more_out = true;

        int rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
        return 0;
    }

    //  Ignore the MORE flag
    msg_->reset_flags (msg_t::more);

    //  This is the last part of the message.
    _more_out = false;

    //  Push the message into the pipe. If there's no out pipe, just drop it.
    if (_current_out) {
        // Close the remote connection if user has asked to do so
        // by sending zero length message.
        // Pending messages in the pipe will be dropped (on receiving term- ack)
        if (msg_->size () == 0) {
            _current_out->terminate (false);
            int rc = msg_->close ();
            errno_assert (rc == 0);
            rc = msg_->init ();
            errno_assert (rc == 0);
            _current_out = NULL;
            return 0;
        }
        const bool ok = _current_out->write (msg_);
        if (likely (ok))
            _current_out->flush ();
        _current_out = NULL;
    } else {
        const int rc = msg_->close ();
        errno_assert (rc == 0);
    }

    //  Detach the message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}